

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintPair.hpp
# Opt level: O2

void __thiscall OpenMD::ConstraintPair::~ConstraintPair(ConstraintPair *this)

{
  ConstraintElem *pCVar1;
  
  pCVar1 = this->consElem1_;
  if (pCVar1 != (ConstraintElem *)0x0) {
    ConstraintElem::~ConstraintElem(pCVar1);
  }
  operator_delete(pCVar1,0x28);
  pCVar1 = this->consElem2_;
  if (pCVar1 != (ConstraintElem *)0x0) {
    ConstraintElem::~ConstraintElem(pCVar1);
  }
  operator_delete(pCVar1,0x28);
  return;
}

Assistant:

~ConstraintPair() {
      delete consElem1_;
      delete consElem2_;
    }